

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix<Finite> __thiscall
Matrix<Finite>::submatrix(Matrix<Finite> *this,uint x1,uint y1,uint x2,uint y2)

{
  row_t this_00;
  uint in_ECX;
  uint in_EDX;
  Finite *extraout_RDX;
  Finite *pFVar1;
  Finite *extraout_RDX_00;
  undefined8 in_RSI;
  undefined8 in_RDI;
  uint in_R8D;
  uint in_R9D;
  Matrix<Finite> MVar2;
  uint j;
  uint i;
  Matrix<Finite> *res;
  Matrix<Finite> *in_stack_ffffffffffffff78;
  MatrixRow<Finite_&> in_stack_ffffffffffffffb0;
  MatrixRow<const_Finite_&> local_38;
  uint local_2c;
  uint local_28;
  undefined1 local_21;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_14 [5];
  
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_ECX;
  local_14[0] = in_EDX;
  if (in_R8D < in_EDX) {
    std::swap<unsigned_int>(local_14,&local_1c);
  }
  if (local_20 < local_18) {
    std::swap<unsigned_int>(&local_18,&local_20);
  }
  local_21 = 0;
  Matrix((Matrix<Finite> *)in_stack_ffffffffffffffb0.arr,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI)
  ;
  pFVar1 = extraout_RDX;
  for (local_28 = local_14[0]; local_28 <= local_1c; local_28 = local_28 + 1) {
    for (local_2c = local_18; local_2c <= local_20; local_2c = local_2c + 1) {
      local_38.arr = (Finite *)operator[](in_stack_ffffffffffffff78,0);
      MatrixRow<const_Finite_&>::operator[](&local_38,local_2c);
      this_00 = operator[](in_stack_ffffffffffffff78,0);
      in_stack_ffffffffffffff78 =
           (Matrix<Finite> *)
           MatrixRow<Finite_&>::operator[]
                     ((MatrixRow<Finite_&> *)&stack0xffffffffffffffb0,local_2c - local_18);
      Finite::operator=(this_00.arr,(Finite *)in_stack_ffffffffffffff78);
      pFVar1 = extraout_RDX_00;
    }
  }
  MVar2.arr = pFVar1;
  MVar2._0_8_ = in_RDI;
  return MVar2;
}

Assistant:

const Matrix<Field> Matrix<Field>::submatrix(unsigned x1, unsigned y1, unsigned x2, unsigned y2) const
{
    if(x1 > x2)
        std::swap(x1, x2);
    if(y1 > y2)
        std::swap(y1, y2);
    Matrix res(x2 - x1 + 1, y2 - y1 + 1);
    for(unsigned i = x1; i <= x2; ++i)
    {
        for(unsigned j = y1; j <= y2; ++j)
        {
            res[i - x1][j - y1] = (*this)[i][j];
        }
    }
    return res;
}